

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O1

int nn_ws_match_token(char *token,char **subj,int case_insensitive,int ignore_leading_sp)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char cVar5;
  char *pcVar6;
  
  if ((token != (char *)0x0) && (pcVar6 = *subj, pcVar6 != (char *)0x0)) {
    cVar5 = *token;
    if (case_insensitive == 0) {
      while (cVar5 != '\0') {
        if (*pcVar6 == '\0') break;
        if (cVar5 != *pcVar6) goto LAB_00131f4d;
        pcVar6 = pcVar6 + 1;
        pcVar1 = token + 1;
        token = token + 1;
        cVar5 = *pcVar1;
      }
    }
    else {
      for (; (cVar5 != '\0' && (cVar2 = *pcVar6, (long)cVar2 != 0)); pcVar6 = pcVar6 + 1) {
        pp_Var4 = __ctype_tolower_loc();
        if ((*pp_Var4)[cVar5] != (*pp_Var4)[cVar2]) goto LAB_00131f4d;
        cVar5 = token[1];
        token = token + 1;
      }
    }
    if ((*pcVar6 == '\0') && (*token != '\0')) {
LAB_00131f4d:
      iVar3 = 0;
    }
    else {
      if (*token != '\0') goto LAB_00131f5d;
      *subj = pcVar6;
      iVar3 = 1;
    }
    return iVar3;
  }
  nn_ws_match_token_cold_2();
LAB_00131f5d:
  nn_ws_match_token_cold_1();
}

Assistant:

static int nn_ws_match_token (const char* token, const char **subj,
    int case_insensitive, int ignore_leading_sp)
{
    const char *pos;

    nn_assert (token && *subj);

    pos = *subj;

    if (ignore_leading_sp) {
        while (*pos == '\x20' && *pos) {
            pos++;
        }
    }

    if (case_insensitive) {
        while (*token && *pos) {
            if (tolower (*token) != tolower (*pos))
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }
    else {
        while (*token && *pos) {
            if (*token != *pos)
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }

    /*  Encountered end of subject before matching completed. */
    if (!*pos && *token)
        return NN_WS_HANDSHAKE_NOMATCH;

    /*  Entire token has been matched. */
    nn_assert (!*token);

    /*  On success, advance subject position. */
    *subj = pos;

    return NN_WS_HANDSHAKE_MATCH;
}